

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseDenseProduct.h
# Opt level: O0

void Eigen::internal::
     sparse_time_dense_product_impl<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_float,_0,_true>
     ::run(SparseMatrix<float,_0,_int> *lhs,Matrix<float,__1,_1,_0,__1,_1> *rhs,
          Matrix<float,__1,_1,_0,__1,_1> *res,float *alpha)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  Index IVar5;
  Scalar *pSVar6;
  SparseMatrix<float,_0,_int> *mat;
  Scalar *pSVar7;
  char *pcVar8;
  int __c;
  undefined1 local_88 [8];
  LhsInnerIterator it;
  long lStack_48;
  ReturnType rhs_j;
  Index j;
  Index c;
  LhsEval lhsEval;
  float *alpha_local;
  Matrix<float,__1,_1,_0,__1,_1> *res_local;
  Matrix<float,__1,_1,_0,__1,_1> *rhs_local;
  SparseMatrix<float,_0,_int> *lhs_local;
  
  lhsEval.super_evaluator<Eigen::SparseCompressedBase<Eigen::SparseMatrix<float,_0,_int>_>_>._8_8_ =
       alpha;
  evaluator<Eigen::SparseMatrix<float,_0,_int>_>::evaluator
            ((evaluator<Eigen::SparseMatrix<float,_0,_int>_> *)&c,lhs);
  j = 0;
  while( true ) {
    IVar5 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::cols
                      (&rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>);
    if (IVar5 <= j) break;
    lStack_48 = 0;
    while( true ) {
      IVar5 = SparseMatrix<float,_0,_int>::outerSize(lhs);
      if (IVar5 <= lStack_48) break;
      fVar1 = *(float *)lhsEval.
                        super_evaluator<Eigen::SparseCompressedBase<Eigen::SparseMatrix<float,_0,_int>_>_>
                        ._8_8_;
      pSVar6 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::coeff
                         (&rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,
                          lStack_48,j);
      fVar2 = *pSVar6;
      mat = internal::evaluator::operator_cast_to_SparseMatrix_((evaluator *)&c);
      SparseCompressedBase<Eigen::SparseMatrix<float,_0,_int>_>::InnerIterator::InnerIterator
                ((InnerIterator *)local_88,
                 &mat->super_SparseCompressedBase<Eigen::SparseMatrix<float,_0,_int>_>,lStack_48);
      while( true ) {
        bVar4 = SparseCompressedBase::InnerIterator::operator_cast_to_bool
                          ((InnerIterator *)local_88);
        if (!bVar4) break;
        pSVar7 = SparseCompressedBase<Eigen::SparseMatrix<float,_0,_int>_>::InnerIterator::value
                           ((InnerIterator *)local_88);
        fVar3 = *pSVar7;
        pcVar8 = SparseCompressedBase<Eigen::SparseMatrix<float,_0,_int>_>::InnerIterator::index
                           ((InnerIterator *)local_88,(char *)mat,__c);
        mat = (SparseMatrix<float,_0,_int> *)(long)(int)pcVar8;
        pSVar6 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::coeffRef
                           (&res->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,
                            (Index)mat,j);
        *pSVar6 = fVar3 * fVar1 * fVar2 + *pSVar6;
        SparseCompressedBase<Eigen::SparseMatrix<float,_0,_int>_>::InnerIterator::operator++
                  ((InnerIterator *)local_88);
      }
      lStack_48 = lStack_48 + 1;
    }
    j = j + 1;
  }
  evaluator<Eigen::SparseMatrix<float,_0,_int>_>::~evaluator
            ((evaluator<Eigen::SparseMatrix<float,_0,_int>_> *)&c);
  return;
}

Assistant:

static void run(const SparseLhsType& lhs, const DenseRhsType& rhs, DenseResType& res, const AlphaType& alpha)
  {
    LhsEval lhsEval(lhs);
    for(Index c=0; c<rhs.cols(); ++c)
    {
      for(Index j=0; j<lhs.outerSize(); ++j)
      {
//        typename Res::Scalar rhs_j = alpha * rhs.coeff(j,c);
        typename ScalarBinaryOpTraits<AlphaType, typename Rhs::Scalar>::ReturnType rhs_j(alpha * rhs.coeff(j,c));
        for(LhsInnerIterator it(lhsEval,j); it ;++it)
          res.coeffRef(it.index(),c) += it.value() * rhs_j;
      }
    }
  }